

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O0

void __thiscall ChatWindow::userLeft(ChatWindow *this,QString *username)

{
  QStandardItemModel *pQVar1;
  QString *pQVar2;
  int iVar3;
  QBrush local_190 [8];
  QBrush local_188 [32];
  QModelIndex local_168;
  undefined1 local_150 [24];
  QVariant local_138 [32];
  QModelIndex local_118;
  undefined1 local_100 [45];
  QLatin1Char local_d3;
  QChar local_d2;
  QString local_d0;
  QString local_b8;
  QVariant local_a0 [32];
  QModelIndex local_80;
  undefined1 local_68 [24];
  QModelIndex local_50;
  QModelIndex local_38;
  int local_1c;
  QString *pQStack_18;
  int newRow;
  QString *username_local;
  ChatWindow *this_local;
  
  pQVar1 = this->m_chatModel;
  pQStack_18 = username;
  username_local = (QString *)this;
  QModelIndex::QModelIndex(&local_38);
  iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_38);
  pQVar1 = this->m_chatModel;
  local_1c = iVar3;
  QModelIndex::QModelIndex(&local_50);
  QStandardItemModel::insertRow(pQVar1,iVar3,&local_50);
  iVar3 = local_1c;
  pQVar1 = this->m_chatModel;
  QModelIndex::QModelIndex(&local_80);
  (**(code **)(*(long *)pQVar1 + 0x60))(local_68,pQVar1,iVar3,0,&local_80);
  tr(&local_d0,"%1 Left the Chat",(char *)0x0,-1);
  pQVar2 = pQStack_18;
  QLatin1Char::QLatin1Char(&local_d3,' ');
  QChar::QChar(&local_d2,local_d3);
  QString::arg((QString *)&local_b8,(int)&local_d0,(QChar *)pQVar2);
  QVariant::QVariant(local_a0,(QString *)&local_b8);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_68,local_a0,2);
  QVariant::~QVariant(local_a0);
  QString::~QString(&local_b8);
  QString::~QString(&local_d0);
  iVar3 = local_1c;
  pQVar1 = this->m_chatModel;
  QModelIndex::QModelIndex(&local_118);
  (**(code **)(*(long *)pQVar1 + 0x60))(local_100,pQVar1,iVar3,0,&local_118);
  QVariant::QVariant(local_138,0x84);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_100,local_138,7);
  QVariant::~QVariant(local_138);
  iVar3 = local_1c;
  pQVar1 = this->m_chatModel;
  QModelIndex::QModelIndex(&local_168);
  (**(code **)(*(long *)pQVar1 + 0x60))(local_150,pQVar1,iVar3,0,&local_168);
  QBrush::QBrush(local_190,7,1);
  QBrush::operator_cast_to_QVariant(local_188);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_150,local_188,9);
  QVariant::~QVariant((QVariant *)local_188);
  QBrush::~QBrush(local_190);
  QAbstractItemView::scrollToBottom();
  QString::clear(&this->m_lastUserName);
  return;
}

Assistant:

void ChatWindow::userLeft(const QString &username)
{
    // store the index of the new row to append to the model containing the messages
    const int newRow = m_chatModel->rowCount();
    // insert a row
    m_chatModel->insertRow(newRow);
    // store in the model the message to comunicate a user left
    m_chatModel->setData(m_chatModel->index(newRow, 0), tr("%1 Left the Chat").arg(username));
    // set the alignment for the text
    m_chatModel->setData(m_chatModel->index(newRow, 0), Qt::AlignCenter, Qt::TextAlignmentRole);
    // set the color for the text
    m_chatModel->setData(m_chatModel->index(newRow, 0), QBrush(Qt::red), Qt::ForegroundRole);
    // scroll the view to display the new message
    ui->chatView->scrollToBottom();
    // reset the last printed username
    m_lastUserName.clear();
}